

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O0

void __thiscall SchnorrSig_Sign_Test::TestBody(SchnorrSig_Sign_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_d8;
  Message local_d0;
  ByteData local_c8;
  string local_b0;
  ByteData local_80;
  string local_68;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  SchnorrSignature sig;
  SchnorrSig_Sign_Test *this_local;
  
  cfd::core::SchnorrUtil::Sign((SchnorrSignature *)&gtest_ar.message_,&::msg,&::sk,&aux_rand);
  cfd::core::SchnorrSignature::GetData(&local_80,&::signature,false);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_68,&local_80);
  cfd::core::SchnorrSignature::GetData(&local_c8,(SchnorrSignature *)&gtest_ar.message_,false);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_b0,&local_c8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_48,"signature.GetData().GetHex()","sig.GetData().GetHex()",
             &local_68,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  cfd::core::ByteData::~ByteData(&local_c8);
  std::__cxx11::string::~string((string *)&local_68);
  cfd::core::ByteData::~ByteData(&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x26,message);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(SchnorrSig, Sign) {
  auto sig = SchnorrUtil::Sign(msg, sk, aux_rand);

  EXPECT_EQ(signature.GetData().GetHex(), sig.GetData().GetHex());
}